

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.c
# Opt level: O0

void ga_pose_log(ga_pose *x)

{
  ga_pose *x_local;
  
  if (x == (ga_pose *)0x0) {
    __assert_fail("x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x50,"void ga_pose_log(const struct ga_pose *)");
  }
  if (x->target_frame == (frame *)0x0) {
    __assert_fail("x->target_frame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x51,"void ga_pose_log(const struct ga_pose *)");
  }
  if (x->target_body == (body *)0x0) {
    __assert_fail("x->target_body",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x52,"void ga_pose_log(const struct ga_pose *)");
  }
  if (x->reference_frame != (frame *)0x0) {
    if (x->reference_body != (body *)0x0) {
      printf("PoseADT(target={%s}|%s, reference={%s}|%s)\n",x->target_frame->name,
             x->target_body->name,x->reference_frame->name,x->reference_body->name);
      return;
    }
    __assert_fail("x->reference_body",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x54,"void ga_pose_log(const struct ga_pose *)");
  }
  __assert_fail("x->reference_frame",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                ,0x53,"void ga_pose_log(const struct ga_pose *)");
}

Assistant:

void ga_pose_log(
        const struct ga_pose *x)
{
    assert(x);
    assert(x->target_frame);
    assert(x->target_body);
    assert(x->reference_frame);
    assert(x->reference_body);

    printf("PoseADT(target={%s}|%s, reference={%s}|%s)\n",
            x->target_frame->name,
            x->target_body->name,
            x->reference_frame->name,
            x->reference_body->name);
}